

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int analysisLoader(void *pData,int argc,char **argv,char **NotUsed)

{
  Table *pTVar1;
  int iVar2;
  uint local_64;
  char *local_60;
  char *z;
  tRowcnt v;
  int n;
  int c;
  int i;
  Table *pTable;
  Index *pIndex;
  analysisInfo *pInfo;
  char **NotUsed_local;
  char **argv_local;
  int argc_local;
  void *pData_local;
  
  if ((((argv != (char **)0x0) && (*argv != (char *)0x0)) && (argv[2] != (char *)0x0)) &&
     (pTVar1 = sqlite3FindTable(*pData,*argv,*(char **)((long)pData + 8)), pTVar1 != (Table *)0x0))
  {
    if (argv[1] == (char *)0x0) {
      pTable = (Table *)0x0;
    }
    else {
      pTable = (Table *)sqlite3FindIndex(*pData,argv[1],*(char **)((long)pData + 8));
    }
    if (pTable == (Table *)0x0) {
      local_64 = 0;
    }
    else {
      local_64 = (uint)(ushort)pTable->nModuleArg;
    }
    local_60 = argv[2];
    for (n = 0; *local_60 != '\0' && n <= (int)local_64; n = n + 1) {
      z._0_4_ = 0;
      for (; iVar2 = (int)*local_60, 0x2f < iVar2 && iVar2 < 0x3a; local_60 = local_60 + 1) {
        z._0_4_ = ((tRowcnt)z * 10 + iVar2) - 0x30;
      }
      if (n == 0) {
        pTVar1->nRowEst = (tRowcnt)z;
      }
      if (pTable == (Table *)0x0) {
        return 0;
      }
      *(tRowcnt *)((long)&pTable->pIndex->zName + (long)n * 4) = (tRowcnt)z;
      if (*local_60 == ' ') {
        local_60 = local_60 + 1;
      }
      iVar2 = strcmp(local_60,"unordered");
      if (iVar2 == 0) {
        *(byte *)((long)&pTable->nModuleArg + 3) =
             *(byte *)((long)&pTable->nModuleArg + 3) & 0xfb | 4;
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

static int analysisLoader(void *pData, int argc, char **argv, char **NotUsed){
  analysisInfo *pInfo = (analysisInfo*)pData;
  Index *pIndex;
  Table *pTable;
  int i, c, n;
  tRowcnt v;
  const char *z;

  assert( argc==3 );
  UNUSED_PARAMETER2(NotUsed, argc);

  if( argv==0 || argv[0]==0 || argv[2]==0 ){
    return 0;
  }
  pTable = sqlite3FindTable(pInfo->db, argv[0], pInfo->zDatabase);
  if( pTable==0 ){
    return 0;
  }
  if( argv[1] ){
    pIndex = sqlite3FindIndex(pInfo->db, argv[1], pInfo->zDatabase);
  }else{
    pIndex = 0;
  }
  n = pIndex ? pIndex->nColumn : 0;
  z = argv[2];
  for(i=0; *z && i<=n; i++){
    v = 0;
    while( (c=z[0])>='0' && c<='9' ){
      v = v*10 + c - '0';
      z++;
    }
    if( i==0 ) pTable->nRowEst = v;
    if( pIndex==0 ) break;
    pIndex->aiRowEst[i] = v;
    if( *z==' ' ) z++;
    if( strcmp(z, "unordered")==0 ){
      pIndex->bUnordered = 1;
      break;
    }
  }
  return 0;
}